

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_CDPause(SDL12_CD *cdrom)

{
  int iVar1;
  SDL12_CD *pSVar2;
  SDL12_CDstatus SVar3;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  
  pSVar2 = ValidCDDevice(cdrom);
  if (pSVar2 == (SDL12_CD *)0x0) {
    iVar1 = -1;
  }
  else {
    if (pSVar2->status == SDL12_CD_TRAYEMPTY) {
      iVar1 = (*SDL20_SetError)("Tray empty",in_RSI,extraout_RDX,SDL20_SetError);
      return iVar1;
    }
    (*SDL20_LockAudio)();
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      SVar3 = audio_cbdata->cdrom_status;
      if (SVar3 == SDL12_CD_PLAYING) {
        audio_cbdata->cdrom_status = SDL12_CD_PAUSED;
        SVar3 = SDL12_CD_PAUSED;
      }
      pSVar2->status = SVar3;
    }
    (*SDL20_UnlockAudio)();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SDLCALL
SDL_CDPause(SDL12_CD *cdrom)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        if (audio_cbdata->cdrom_status == SDL12_CD_PLAYING) {
            audio_cbdata->cdrom_status = SDL12_CD_PAUSED;
        }
        cdrom->status = audio_cbdata->cdrom_status;
    }
    SDL20_UnlockAudio();
    return 0;
}